

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O1

void Gia_Iso2ManPrepare(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  uint *puVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  
  uVar1 = p->nObjs;
  if ((0 < (int)uVar1) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    puVar5 = &p->pObjs->Value;
    uVar7 = (ulong)uVar1;
    do {
      uVar3 = *(ulong *)(puVar5 + -2);
      uVar8 = 0;
      if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
        iVar2 = *(int *)((long)puVar5 + (ulong)(uint)((int)(uVar3 & 0x1fffffff) << 2) * -3);
        iVar9 = *(int *)((long)puVar5 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3);
        if (iVar9 < iVar2) {
          iVar9 = iVar2;
        }
        uVar8 = iVar9 + 1;
      }
      *puVar5 = uVar8;
      puVar5 = puVar5 + 3;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  pGVar4 = p->pObjs;
  pGVar4->Value = 0x1b47586d;
  if (1 < (int)uVar1) {
    lVar6 = 0;
    do {
      uVar7 = *(ulong *)(&pGVar4[1].field_0x0 + lVar6);
      uVar8 = (uint)uVar7;
      if ((~uVar8 & 0x1fffffff) == 0 || (int)uVar8 < 0) {
        if ((uVar8 & 0x9fffffff) == 0x9fffffff) {
          uVar8 = (uint)(uVar7 >> 0x20);
          if ((int)(uVar8 & 0x1fffffff) < p->vCis->nSize - p->nRegs) {
            *(undefined4 *)((long)&pGVar4[1].Value + lVar6) = 0xfbea205c;
          }
          else if (p->vCis->nSize - p->nRegs <= (int)(uVar8 & 0x1fffffff)) {
            *(undefined4 *)((long)&pGVar4[1].Value + lVar6) = 0x22924fcd;
          }
        }
      }
      else {
        *(uint *)((long)&pGVar4[1].Value + lVar6) =
             *(int *)((long)s_256Primes +
                     (ulong)((((uVar8 >> 0x1d & 1) != 0) + 0xf5 + (uint)((uVar7 >> 0x3d & 1) != 0))
                            * 4)) + s_256Primes[*(byte *)((long)&pGVar4[1].Value + lVar6)];
      }
      lVar6 = lVar6 + 0xc;
    } while ((ulong)uVar1 * 0xc + -0xc != lVar6);
  }
  return;
}

Assistant:

void Gia_Iso2ManPrepare( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
        pObj->Value = Gia_ObjIsAnd(pObj) ? 1 + Abc_MaxInt(Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value) : 0;
    Gia_ManConst0(p)->Value = s_256Primes[ISO_MASK];
    Gia_ManForEachObj1( p, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = s_256Primes[pObj->Value & ISO_MASK] + s_256Primes[ISO_MASK - 10 + Gia_ObjFaninC0(pObj) + Gia_ObjFaninC1(pObj)];
        else if ( Gia_ObjIsPi(p, pObj) )
            pObj->Value = s_256Primes[ISO_MASK-1];
        else if ( Gia_ObjIsRo(p, pObj) )
            pObj->Value = s_256Primes[ISO_MASK-2];
}